

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

uint16_t * __thiscall
capnp::SchemaLoader::Validator::makeMemberInfoArray(Validator *this,uint32_t *count)

{
  ulong uVar1;
  ulong uVar2;
  Leaf *pLVar3;
  TreeMap<capnp::Text::Reader,_unsigned_int> *__range2;
  ArrayPtr<unsigned_short> AVar4;
  Iterator __begin2;
  Iterator __end2;
  
  uVar1 = ((long)(this->members).table.rows.builder.pos -
          (long)(this->members).table.rows.builder.ptr) / 0x18;
  *count = (uint32_t)uVar1;
  AVar4 = kj::Arena::allocateArray<unsigned_short>(&this->loader->arena,uVar1 & 0xffffffff);
  __begin2.super_TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>.table =
       (this->members).table.rows.builder.ptr;
  __begin2.inner.tree = (this->members).table.indexes.impl.tree;
  pLVar3 = (Leaf *)(__begin2.inner.tree + (this->members).table.indexes.impl.beginLeaf);
  __begin2.inner.row = 0;
  __begin2.inner.leaf = pLVar3;
  kj::TreeMap<capnp::Text::Reader,_unsigned_int>::end(&__end2,&this->members);
  uVar2 = 0;
  uVar1 = 0;
  while ((pLVar3 != __end2.inner.leaf || ((uint)uVar2 != __end2.inner.row))) {
    AVar4.ptr[uVar1] =
         (uint16_t)
         __begin2.super_TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>.table
         [pLVar3->rows[uVar2].i - 1].value;
    kj::_::BTreeImpl::Iterator::operator++(&__begin2.inner);
    uVar1 = (ulong)((int)uVar1 + 1);
    pLVar3 = __begin2.inner.leaf;
    uVar2 = (ulong)__begin2.inner.row;
  }
  return AVar4.ptr;
}

Assistant:

const uint16_t* makeMemberInfoArray(uint32_t* count) {
    *count = members.size();
    kj::ArrayPtr<uint16_t> result = loader.arena.allocateArray<uint16_t>(*count);
    uint pos = 0;
    for (auto& member: members) {
      result[pos++] = member.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }